

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfdata.cpp
# Opt level: O1

vector<double,_std::allocator<double>_> * __thiscall
PFData::fileReadSubgridAtGridIndex
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,PFData *this,int gridZ,
          int gridY,int gridX)

{
  pointer pdVar1;
  int iVar2;
  ostream *poVar3;
  char *__s;
  size_t sVar4;
  fpos_t pos;
  fpos_t local_48;
  
  iVar2 = this->m_p;
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,
             (long)(int)(((uint)(gridX < this->m_nx % iVar2) + this->m_nx / iVar2) *
                         ((uint)(gridY < this->m_ny % this->m_q) + this->m_ny / iVar2) *
                        ((uint)(gridZ < this->m_nz % this->m_r) + this->m_nz / this->m_r)),
             (allocator_type *)&local_48);
  local_48.__pos = 0;
  local_48.__state.__count = 0;
  local_48.__state.__value = (_union_27)0x0;
  fgetpos((FILE *)this->m_fp,&local_48);
  iVar2 = fileReadSubgridAtGridIndexInternal
                    (this,(__return_storage_ptr__->
                          super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_start,this->m_fp,gridZ,gridY,gridX);
  fsetpos((FILE *)this->m_fp,&local_48);
  if (iVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error while reading subgrid at subgrid index(ZYX): {",0x34);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,gridZ);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,gridY);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,gridX);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"}, error code ",0xe);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
    __s = strerror(iVar2);
    if (__s == (char *)0x0) {
      std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
    }
    else {
      sVar4 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,__s,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    pdVar1 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_finish != pdVar1) {
      (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_finish = pdVar1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> PFData::fileReadSubgridAtGridIndex(int gridZ, int gridY, int gridX){
    const long count = getSubgridSizeZ(gridZ) * getSubgridSizeY(gridY) * getSubgridSizeX(gridX);

    //Fill with empty data
    std::vector<double> result(count);

    std::fpos_t pos{};
    //Save old position
    std::fgetpos(m_fp, &pos);

    int ret = fileReadSubgridAtGridIndexInternal(result.data(), m_fp, gridZ, gridY, gridX);

    //Restore old position
    std::fsetpos(m_fp, &pos);

    if(ret){
        std::cerr << "Error while reading subgrid at subgrid index(ZYX): {" << gridZ << ", " << gridY << ", " << gridX << "}, error code " << ret << ": " << std::strerror(ret) << "\n";
        result.clear();
    }

    return result;
}